

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

PiecewiseLinearSpectrum *
pbrt::PiecewiseLinearSpectrum::FromInterleaved
          (span<const_float> samples,bool normalize,Allocator alloc)

{
  float fVar1;
  size_t sVar2;
  char (*args_2) [14];
  float *pfVar3;
  reference pvVar4;
  char *fmt;
  char (*args) [14];
  PiecewiseLinearSpectrum *pPVar5;
  byte in_DL;
  Float FVar6;
  PiecewiseLinearSpectrum *spec;
  value_type vb_1;
  value_type va_1;
  size_t i;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> v;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> lambda;
  int n;
  size_t vb;
  int va;
  PiecewiseLinearSpectrum *in_stack_fffffffffffffe98;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffea0;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffea8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffeb0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  char (*in_stack_fffffffffffffee8) [26];
  char (*in_stack_fffffffffffffef0) [2];
  char *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  int iVar7;
  char *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  LogLevel LVar8;
  char (*in_stack_ffffffffffffff20) [2];
  int *in_stack_ffffffffffffff28;
  polymorphic_allocator<float> *alloc_00;
  char (*in_stack_ffffffffffffff30) [19];
  polymorphic_allocator<float> *alloc_01;
  float *in_stack_ffffffffffffff38;
  ulong local_a0;
  polymorphic_allocator<float> local_88;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_80;
  polymorphic_allocator<float> local_60;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_58;
  int local_34;
  ulong local_30;
  int local_28;
  byte local_21;
  span<const_float> local_18;
  
  LVar8 = (LogLevel)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  iVar7 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  local_21 = in_DL & 1;
  local_28 = 0;
  sVar2 = pstd::span<const_float>::size(&local_18);
  local_30 = sVar2 & 1;
  if ((long)local_28 != local_30) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (LVar8,in_stack_ffffffffffffff08,iVar7,in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef0,(char (*) [19])in_stack_fffffffffffffee8,
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
               (unsigned_long *)in_stack_ffffffffffffff38);
  }
  sVar2 = pstd::span<const_float>::size(&local_18);
  local_34 = (int)(sVar2 >> 1);
  alloc_00 = &local_60;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator(&in_stack_fffffffffffffea0->alloc);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(&local_58,alloc_00);
  alloc_01 = &local_88;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator(&in_stack_fffffffffffffea0->alloc);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(&local_80,alloc_01);
  args_2 = (char (*) [14])pstd::span<const_float>::operator[](&local_18,0);
  if (360.0 < *(float *)*args_2) {
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
              (in_stack_fffffffffffffeb0,(float *)in_stack_fffffffffffffea8);
    pstd::span<const_float>::operator[](&local_18,1);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
              (in_stack_fffffffffffffeb0,(float *)in_stack_fffffffffffffea8);
  }
  local_a0 = 0;
  do {
    if ((ulong)(long)local_34 <= local_a0) {
      pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::back(&local_58);
      if (*pvVar4 < 830.0) {
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
                  (in_stack_fffffffffffffeb0,(float *)in_stack_fffffffffffffea8);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::back(&local_80);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
                  (in_stack_fffffffffffffeb0,(float *)in_stack_fffffffffffffea8);
      }
      pPVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::PiecewiseLinearSpectrum,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                         ((polymorphic_allocator<std::byte> *)
                          CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                          in_stack_fffffffffffffea8);
      if ((local_21 & 1) != 0) {
        Spectrum::TaggedPointer<pbrt::PiecewiseLinearSpectrum>
                  ((Spectrum *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        Spectra::Y();
        Spectrum::TaggedPointer<pbrt::DenselySampledSpectrum_const>
                  ((Spectrum *)in_stack_fffffffffffffea0,
                   (DenselySampledSpectrum *)in_stack_fffffffffffffe98);
        FVar6 = InnerProduct((Spectrum *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                             (Spectrum *)in_stack_fffffffffffffeb8);
        Scale((PiecewiseLinearSpectrum *)CONCAT44(FVar6,in_stack_fffffffffffffec0),
              (Float)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      }
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                (in_stack_fffffffffffffea0);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                (in_stack_fffffffffffffea0);
      return pPVar5;
    }
    pfVar3 = pstd::span<const_float>::operator[](&local_18,local_a0 * 2);
    LVar8 = (LogLevel)((ulong)pfVar3 >> 0x20);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
              (in_stack_fffffffffffffeb0,(float *)in_stack_fffffffffffffea8);
    pfVar3 = pstd::span<const_float>::operator[](&local_18,local_a0 * 2 + 1);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
              (in_stack_fffffffffffffeb0,(float *)in_stack_fffffffffffffea8);
    if (local_a0 != 0) {
      pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::back(&local_58);
      fVar1 = *pvVar4;
      fmt = (char *)pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(&local_58);
      iVar7 = (int)((ulong)pvVar4 >> 0x20);
      args = (char (*) [14])
             pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (&local_58,(size_type)(fmt + -2));
      if (fVar1 <= *(float *)*args) {
        LogFatal<char_const(&)[14],char_const(&)[26],char_const(&)[14],float&,char_const(&)[26],float&>
                  (LVar8,(char *)pfVar3,iVar7,fmt,args,in_stack_fffffffffffffee8,args_2,
                   (float *)alloc_00,(char (*) [26])alloc_01,in_stack_ffffffffffffff38);
      }
    }
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

PiecewiseLinearSpectrum *PiecewiseLinearSpectrum::FromInterleaved(
    pstd::span<const Float> samples, bool normalize, Allocator alloc) {
    CHECK_EQ(0, samples.size() % 2);
    int n = samples.size() / 2;
    pstd::vector<Float> lambda, v;

    // Extend samples to cover range of visible wavelengths if needed.
    if (samples[0] > Lambda_min) {
        lambda.push_back(Lambda_min - 1);
        v.push_back(samples[1]);
    }
    for (size_t i = 0; i < n; ++i) {
        lambda.push_back(samples[2 * i]);
        v.push_back(samples[2 * i + 1]);
        if (i > 0)
            CHECK_GT(lambda.back(), lambda[lambda.size() - 2]);
    }
    if (lambda.back() < Lambda_max) {
        lambda.push_back(Lambda_max + 1);
        v.push_back(v.back());
    }

    PiecewiseLinearSpectrum *spec =
        alloc.new_object<pbrt::PiecewiseLinearSpectrum>(lambda, v, alloc);

    if (normalize)
        // Normalize to have luminance of 1.
        spec->Scale(CIE_Y_integral / InnerProduct(spec, &Spectra::Y()));

    return spec;
}